

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O1

char * rnndec_decodeval(rnndeccontext *ctx,rnntypeinfo *ti,uint64_t value,int width)

{
  rnnbitfield **pprVar1;
  rnnbitfield *prVar2;
  rnnvalue **pprVar3;
  rnnvalue *prVar4;
  envy_colors *peVar5;
  bool bVar6;
  undefined1 auVar7 [12];
  int iVar8;
  rnnbitfield ***ppprVar9;
  rnnvalue ***ppprVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  char **__ptr;
  char *pcVar14;
  int *piVar15;
  char *pcVar16;
  char *__fmt;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  float fVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char *res;
  char *tmp;
  char *local_58;
  char *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pcVar12 = (char *)(ulong)(uint)width;
code_r0x0010756b:
  uVar20 = value >> 0x20;
  local_58 = (char *)0x0;
  if (ti != (rnntypeinfo *)0x0) {
    iVar18 = ti->shr;
    uVar17 = value << ((byte)iVar18 & 0x3f);
    uVar20 = uVar17;
    if (iVar18 == 0) {
      uVar20 = value;
    }
    iVar8 = (int)(uVar17 >> 0x20);
    if (iVar18 == 0) {
      iVar8 = (int)(value >> 0x20);
    }
    lVar11 = (long)ti->add;
    uVar17 = (uVar20 & 0xffffffff) + lVar11;
    uVar13 = uVar17;
    if (lVar11 == 0) {
      uVar13 = uVar20;
    }
    value = uVar13 & 0xffffffff;
    iVar18 = (int)(uVar17 >> 0x20);
    if (lVar11 == 0) {
      iVar18 = 0;
    }
    uVar19 = iVar18 + iVar8;
    uVar20 = (ulong)uVar19;
    switch(ti->type) {
    case RNN_TTYPE_INLINE_ENUM:
      ppprVar10 = &ti->vals;
      piVar15 = &ti->valsnum;
      break;
    case RNN_TTYPE_INLINE_BITSET:
      ppprVar9 = &ti->bitfields;
      piVar15 = &ti->bitfieldsnum;
      goto LAB_0010775d;
    case RNN_TTYPE_ENUM:
      ppprVar10 = &ti->eenum->vals;
      piVar15 = &ti->eenum->valsnum;
      break;
    case RNN_TTYPE_BITSET:
      ppprVar9 = &ti->ebitset->bitfields;
      piVar15 = &ti->ebitset->bitfieldsnum;
LAB_0010775d:
      iVar18 = *piVar15;
      if ((long)iVar18 < 1) {
        uVar17 = 0xffffffffffffffff;
        goto LAB_00107a0e;
      }
      pprVar1 = *ppprVar9;
      local_40 = value | uVar20 << 0x20;
      lVar11 = 0;
      uVar17 = 0;
      local_48 = value;
      goto LAB_00107788;
    case RNN_TTYPE_SPECTYPE:
      goto switchD_001075ef_caseD_4;
    default:
      goto switchD_001075ef_caseD_5;
    case RNN_TTYPE_INT:
      uVar20 = value | uVar20 << 0x20;
      peVar5 = ctx->colors;
      if ((uVar20 >> ((ulong)(width - 1U & 0xff) & 0x3f) & 1) == 0) {
        pcVar12 = peVar5->reset;
        pcVar16 = "%s%li%s";
      }
      else {
        uVar20 = (1L << ((byte)width & 0x3f)) - uVar20;
        pcVar12 = peVar5->reset;
        pcVar16 = "%s-%li%s";
      }
      asprintf(&local_58,pcVar16,peVar5->num,uVar20,pcVar12);
      return local_58;
    case RNN_TTYPE_UINT:
      pcVar16 = ctx->colors->reset;
      pcVar14 = ctx->colors->num;
      pcVar12 = (char *)(value | uVar20 << 0x20);
      __fmt = "%s%lu%s";
      goto LAB_00107bac;
    case RNN_TTYPE_FLOAT:
switchD_001075ef_caseD_8:
      if (width == 0x10) {
        pcVar12 = ctx->colors->num;
        fVar21 = float16((uint16_t)value);
        dVar22 = (double)fVar21;
LAB_00107b7a:
        asprintf(&local_58,"%s%f%s",dVar22,pcVar12);
        bVar6 = false;
        pcVar12 = local_58;
      }
      else {
        if (width == 0x20) {
          pcVar12 = ctx->colors->num;
          dVar22 = (double)(float)uVar13;
          goto LAB_00107b7a;
        }
        if (width == 0x40) {
          pcVar12 = ctx->colors->num;
          dVar22 = (double)(value | uVar20 << 0x20);
          goto LAB_00107b7a;
        }
        bVar6 = true;
      }
      if (!bVar6) {
        return pcVar12;
      }
      goto switchD_001075ef_caseD_5;
    case RNN_TTYPE_BOOLEAN:
      uVar17 = value | uVar20 << 0x20;
      if (uVar17 == 1) {
        pcVar12 = ctx->colors->reset;
        pcVar16 = ctx->colors->eval;
        pcVar14 = "%sTRUE%s";
      }
      else {
        if (uVar17 != 0) goto switchD_001075ef_caseD_8;
        pcVar12 = ctx->colors->reset;
        pcVar16 = ctx->colors->eval;
        pcVar14 = "%sFALSE%s";
      }
      __ptr = &local_58;
      asprintf(__ptr,pcVar14,pcVar16,pcVar12);
      goto LAB_00107bbb;
    case RNN_TTYPE_FIXED:
      uVar20 = value | uVar20 << 0x20;
      if ((uVar20 >> ((ulong)(width - 1U & 0xff) & 0x3f) & 1) == 0) goto switchD_001075ef_caseD_b;
      pcVar12 = ctx->colors->reset;
      pcVar16 = ctx->colors->num;
      lVar11 = (1L << ((byte)width & 0x3f)) - uVar20;
      auVar23._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar23._0_8_ = lVar11;
      auVar23._12_4_ = 0x45300000;
      dVar22 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) /
               (double)(1 << ((byte)ti->radix & 0x1f));
      pcVar14 = "%s-%lf%s (%08lx)";
      goto LAB_001076c0;
    case RNN_TTYPE_UFIXED:
switchD_001075ef_caseD_b:
      pcVar12 = ctx->colors->reset;
      pcVar16 = ctx->colors->num;
      auVar7._4_4_ = uVar19;
      auVar7._0_4_ = uVar19;
      auVar7._8_4_ = 0;
      auVar24._0_12_ = auVar7 << 0x20;
      auVar24._12_4_ = 0x45300000;
      dVar22 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(float)uVar13) - 4503599627370496.0)) /
               (double)(1 << ((byte)ti->radix & 0x1f));
      pcVar14 = "%s%lf%s (%08lx)";
LAB_001076c0:
      __ptr = &local_58;
      asprintf(__ptr,pcVar14,dVar22,pcVar16,pcVar12);
      goto LAB_00107bbb;
    }
    iVar18 = *piVar15;
    if (0 < (long)iVar18) {
      pprVar3 = *ppprVar10;
      uVar17 = value | uVar20 << 0x20;
      lVar11 = 0;
      local_48 = value;
      goto LAB_00107938;
    }
  }
  goto switchD_001075ef_caseD_5;
switchD_001075ef_caseD_4:
  ti = &ti->spectype->typeinfo;
  value = value | uVar20 << 0x20;
  goto code_r0x0010756b;
LAB_00107788:
  do {
    iVar8 = rnndec_varmatch(ctx,&pprVar1[lVar11]->varinfo);
    if (iVar8 != 0) {
      prVar2 = pprVar1[lVar11];
      uVar13 = (prVar2->mask & local_40) >> ((byte)prVar2->low & 0x3f);
      uVar17 = uVar17 | prVar2->mask;
      if ((prVar2->typeinfo).type == RNN_TTYPE_BOOLEAN) {
        if (uVar13 != 0) {
          if (uVar13 != 1) goto LAB_00107818;
          if (local_58 == (char *)0x0) {
            asprintf(&local_58,"%s%s%s",ctx->colors->mod,prVar2->name,ctx->colors->reset);
          }
          else {
            asprintf(&local_50,"%s | %s%s%s",local_58,ctx->colors->mod,prVar2->name,
                     ctx->colors->reset);
            free(local_58);
            local_58 = local_50;
          }
        }
      }
      else {
LAB_00107818:
        local_38 = uVar17;
        pcVar12 = rnndec_decodeval(ctx,&prVar2->typeinfo,uVar13,(prVar2->high - prVar2->low) + 1);
        if (local_58 == (char *)0x0) {
          asprintf(&local_58,"%s%s%s = %s",ctx->colors->rname,pprVar1[lVar11]->name,
                   ctx->colors->reset,pcVar12);
        }
        else {
          asprintf(&local_50,"%s | %s%s%s = %s",local_58,ctx->colors->rname,pprVar1[lVar11]->name,
                   ctx->colors->reset,pcVar12);
          free(local_58);
          local_58 = local_50;
        }
        free(pcVar12);
        uVar17 = local_38;
      }
    }
    lVar11 = lVar11 + 1;
  } while (iVar18 != lVar11);
  uVar17 = ~uVar17;
  value = local_48;
LAB_00107a0e:
  uVar17 = (value & 0xffffffff | uVar20 << 0x20) & uVar17;
  if (uVar17 != 0) {
    if (local_58 == (char *)0x0) {
      asprintf(&local_58,"%s%#lx%s",ctx->colors->err,uVar17,ctx->colors->reset);
    }
    else {
      asprintf(&local_50,"%s | %s%#lx%s");
      free(local_58);
      local_58 = local_50;
    }
  }
  if (local_58 == (char *)0x0) {
    asprintf(&local_58,"%s0%s",ctx->colors->num,ctx->colors->reset);
  }
  __ptr = &local_50;
  asprintf(__ptr,"{ %s }",local_58);
  free(local_58);
  goto LAB_00107bbb;
  while (lVar11 = lVar11 + 1, value = local_48, iVar18 != lVar11) {
LAB_00107938:
    iVar8 = rnndec_varmatch(ctx,&pprVar3[lVar11]->varinfo);
    if (((iVar8 != 0) && (prVar4 = pprVar3[lVar11], prVar4->valvalid != 0)) &&
       (prVar4->value == uVar17)) {
      pcVar16 = ctx->colors->reset;
      pcVar14 = ctx->colors->eval;
      pcVar12 = prVar4->name;
      __fmt = "%s%s%s";
      goto LAB_00107bac;
    }
  }
switchD_001075ef_caseD_5:
  pcVar16 = ctx->colors->reset;
  pcVar14 = ctx->colors->num;
  pcVar12 = (char *)(value & 0xffffffff | uVar20 << 0x20);
  __fmt = "%s%#lx%s";
LAB_00107bac:
  __ptr = &local_58;
  asprintf(__ptr,__fmt,pcVar14,pcVar12,pcVar16);
LAB_00107bbb:
  return *__ptr;
}

Assistant:

char *rnndec_decodeval(struct rnndeccontext *ctx, struct rnntypeinfo *ti, uint64_t value, int width) {
	char *res = 0;
	int i;
	struct rnnvalue **vals;
	int valsnum;
	struct rnnbitfield **bitfields;
	int bitfieldsnum;
	char *tmp;
	uint64_t mask;
	if (!ti)
		goto failhex;
	if (ti->shr) value <<= ti->shr;
	if (ti->add) value += ti->add;
	switch (ti->type) {
		case RNN_TTYPE_ENUM:
			vals = ti->eenum->vals;
			valsnum = ti->eenum->valsnum;
			goto doenum;
		case RNN_TTYPE_INLINE_ENUM:
			vals = ti->vals;
			valsnum = ti->valsnum;
			goto doenum;
		doenum:
			for (i = 0; i < valsnum; i++)
				if (rnndec_varmatch(ctx, &vals[i]->varinfo) && vals[i]->valvalid && vals[i]->value == value) {
					asprintf (&res, "%s%s%s", ctx->colors->eval, vals[i]->name, ctx->colors->reset);
					return res;
				}
			goto failhex;
		case RNN_TTYPE_BITSET:
			bitfields = ti->ebitset->bitfields;
			bitfieldsnum = ti->ebitset->bitfieldsnum;
			goto dobitset;
		case RNN_TTYPE_INLINE_BITSET:
			bitfields = ti->bitfields;
			bitfieldsnum = ti->bitfieldsnum;
			goto dobitset;
		dobitset:
			mask = 0;
			for (i = 0; i < bitfieldsnum; i++) {
				if (!rnndec_varmatch(ctx, &bitfields[i]->varinfo))
					continue;
				uint64_t sval = (value & bitfields[i]->mask) >> bitfields[i]->low;
				mask |= bitfields[i]->mask;
				if (bitfields[i]->typeinfo.type == RNN_TTYPE_BOOLEAN) {
					if (sval == 0)
						continue;
					else if (sval == 1) {
						if (!res)
							asprintf (&res, "%s%s%s", ctx->colors->mod, bitfields[i]->name, ctx->colors->reset);
						else {
							asprintf (&tmp, "%s | %s%s%s", res, ctx->colors->mod, bitfields[i]->name, ctx->colors->reset);
							free(res);
							res = tmp;
						}
						continue;
					}
				}
				char *subval = rnndec_decodeval(ctx, &bitfields[i]->typeinfo, sval, bitfields[i]->high - bitfields[i]->low + 1);
				if (!res)
					asprintf (&res, "%s%s%s = %s", ctx->colors->rname, bitfields[i]->name, ctx->colors->reset, subval);
				else {
					asprintf (&tmp, "%s | %s%s%s = %s", res, ctx->colors->rname, bitfields[i]->name, ctx->colors->reset, subval);
					free(res);
					res = tmp;
				}
				free(subval);
			}
			if (value & ~mask) {
				if (!res)
					asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->err, value & ~mask, ctx->colors->reset);
				else {
					asprintf (&tmp, "%s | %s%#"PRIx64"%s", res, ctx->colors->err, value & ~mask, ctx->colors->reset);
					free(res);
					res = tmp;
				}
			}
			if (!res)
				asprintf (&res, "%s0%s", ctx->colors->num, ctx->colors->reset);
			asprintf (&tmp, "{ %s }", res);
			free(res);
			return tmp;
		case RNN_TTYPE_SPECTYPE:
			return rnndec_decodeval(ctx, &ti->spectype->typeinfo, value, width);
		case RNN_TTYPE_HEX:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
		case RNN_TTYPE_FIXED:
			if (value & UINT64_C(1) << (width-1)) {
				asprintf (&res, "%s-%lf%s (%08"PRIx64")", ctx->colors->num,
						((double)((UINT64_C(1) << width) - value)) / ((double)(1 << ti->radix)),
						ctx->colors->reset, value);
				return res;
			}
			/* fallthrough */
		case RNN_TTYPE_UFIXED:
			asprintf (&res, "%s%lf%s (%08"PRIx64")", ctx->colors->num,
					((double)value) / ((double)(1 << ti->radix)),
					ctx->colors->reset, value);
			return res;
		case RNN_TTYPE_UINT:
			asprintf (&res, "%s%"PRIu64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
		case RNN_TTYPE_INT:
			if (value & UINT64_C(1) << (width-1))
				asprintf (&res, "%s-%"PRIi64"%s", ctx->colors->num, (UINT64_C(1) << width) - value, ctx->colors->reset);
			else
				asprintf (&res, "%s%"PRIi64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
		case RNN_TTYPE_BOOLEAN:
			if (value == 0) {
				asprintf (&res, "%sFALSE%s", ctx->colors->eval, ctx->colors->reset);
				return res;
			} else if (value == 1) {
				asprintf (&res, "%sTRUE%s", ctx->colors->eval, ctx->colors->reset);
				return res;
			}
		case RNN_TTYPE_FLOAT: {
			union { uint64_t i; float f; double d; } val;
			val.i = value;
			if (width == 64)
				asprintf(&res, "%s%f%s", ctx->colors->num,
					val.d, ctx->colors->reset);
			else if (width == 32)
				asprintf(&res, "%s%f%s", ctx->colors->num,
					val.f, ctx->colors->reset);
			else if (width == 16)
				asprintf(&res, "%s%f%s", ctx->colors->num,
					float16(value), ctx->colors->reset);
			else
				goto failhex;

			return res;
		}
		failhex:
		default:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
			break;
	}
}